

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw_pal.cpp
# Opt level: O1

void __thiscall
swrenderer::PalSkyCommand::PalSkyCommand
          (PalSkyCommand *this,uint32_t solid_top,uint32_t solid_bottom)

{
  int iVar1;
  uint8_t *puVar2;
  long lVar3;
  
  (this->super_DrawerCommand)._vptr_DrawerCommand = (_func_int **)&PTR__DrawerCommand_006ef860;
  puVar2 = drawerargs::dc_dest;
  iVar1 = drawerargs::dc_pitch;
  (this->super_DrawerCommand)._dest_y =
       (int)(((long)drawerargs::dc_dest - drawerargs::dc_destorg) / (long)drawerargs::dc_pitch);
  (this->super_DrawerCommand)._vptr_DrawerCommand = (_func_int **)&PTR__DrawerCommand_006eeae8;
  *(uint32_t *)&(this->super_DrawerCommand).field_0xc = solid_top;
  this->solid_bottom = solid_bottom;
  this->_dest = puVar2;
  this->_count = drawerargs::dc_count;
  this->_pitch = iVar1;
  lVar3 = 0;
  do {
    *(undefined8 *)((long)this->_source + lVar3 * 2) =
         *(undefined8 *)((long)&drawerargs::dc_wall_source + lVar3 * 2);
    *(undefined8 *)((long)this->_source2 + lVar3 * 2) =
         *(undefined8 *)((long)&drawerargs::dc_wall_source2 + lVar3 * 2);
    *(undefined4 *)((long)this->_sourceheight + lVar3) =
         *(undefined4 *)((long)&drawerargs::dc_wall_sourceheight + lVar3);
    *(undefined4 *)((long)this->_iscale + lVar3) =
         *(undefined4 *)((long)&drawerargs::dc_wall_iscale + lVar3);
    *(undefined4 *)((long)this->_texturefrac + lVar3) =
         *(undefined4 *)((long)&drawerargs::dc_wall_texturefrac + lVar3);
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0x10);
  return;
}

Assistant:

PalSkyCommand::PalSkyCommand(uint32_t solid_top, uint32_t solid_bottom) : solid_top(solid_top), solid_bottom(solid_bottom)
	{
		using namespace drawerargs;

		_dest = dc_dest;
		_count = dc_count;
		_pitch = dc_pitch;
		for (int col = 0; col < 4; col++)
		{
			_source[col] = dc_wall_source[col];
			_source2[col] = dc_wall_source2[col];
			_sourceheight[col] = dc_wall_sourceheight[col];
			_iscale[col] = dc_wall_iscale[col];
			_texturefrac[col] = dc_wall_texturefrac[col];
		}
	}